

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void wasm::Literal::printVec128(ostream *o,array<unsigned_char,_16UL> *v)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  
  *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
       *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
  for (uVar2 = 0; uVar2 < 0x10; uVar2 = uVar2 + 4) {
    if (uVar2 != 0) {
      std::operator<<(o," ");
    }
    poVar1 = std::operator<<(o,"0x");
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
       *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void Literal::printVec128(std::ostream& o, const std::array<uint8_t, 16>& v) {
  o << std::hex;
  for (auto i = 0; i < 16; i += 4) {
    if (i) {
      o << " ";
    }
    o << "0x" << std::setfill('0') << std::setw(8)
      << uint32_t(v[i] | (v[i + 1] << 8) | (v[i + 2] << 16) | (v[i + 3] << 24));
  }
  o << std::dec;
}